

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

void __thiscall H264StreamReader::~H264StreamReader(H264StreamReader *this)

{
  SPSUnit *this_00;
  NALUnit *this_01;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (SPSUnit *)p_Var1[1]._M_parent;
    if (this_00 != (SPSUnit *)0x0) {
      SPSUnit::~SPSUnit(this_00);
    }
    operator_delete(this_00,0x200);
  }
  for (p_Var1 = (this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_01 = (NALUnit *)p_Var1[1]._M_parent;
    if (this_01 != (NALUnit *)0x0) {
      NALUnit::~NALUnit(this_01);
    }
    operator_delete(this_01,0x58);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_decodedSliceHeader).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_bdRomMetaDataMsg).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_lastSeiMvcHeader).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->updatedSPSList)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_PPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_PPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
  ::~_Rb_tree(&(this->m_ppsMap)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_SPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
  ::~_Rb_tree(&(this->m_spsMap)._M_t);
  MPEGStreamReader::~MPEGStreamReader(&this->super_MPEGStreamReader);
  return;
}

Assistant:

H264StreamReader::~H264StreamReader()
{
    for (const auto &[index, sps] : m_spsMap) delete sps;
    for (const auto &[index, pps] : m_ppsMap) delete pps;
}